

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

void Acb_NtkUpdateTiming(Acb_Ntk_t *p,int iObj)

{
  Vec_Que_t *pVVar1;
  int *piVar2;
  bool bVar3;
  uint __line;
  int iVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  ulong uVar5;
  int iVar6;
  long lVar7;
  char *__assertion;
  
  iVar6 = p->LevelMax;
  p_00 = Acb_ObjCollectTfi(p,iObj,1);
  p_01 = Acb_ObjCollectTfo(p,iObj,1);
  if (0 < iObj) {
    iVar4 = Vec_IntEntryLast(p_00);
    if (iVar4 != iObj) {
      __assert_fail("Vec_IntEntryLast(vTfi) == iObj",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                    ,0x243,"void Acb_NtkUpdateTiming(Acb_Ntk_t *, int)");
    }
    iVar4 = Vec_IntEntryLast(p_01);
    if (iVar4 != iObj) {
      __assert_fail("Vec_IntEntryLast(vTfo) == iObj",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                    ,0x244,"void Acb_NtkUpdateTiming(Acb_Ntk_t *, int)");
    }
    if (p_01->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
    }
    p_01->nSize = p_01->nSize + -1;
  }
  Acb_NtkComputeLevelD(p,p_01);
  iVar4 = p->LevelMax;
  Acb_NtkComputeLevelR(p,p_00);
  if (iVar4 != p->LevelMax) {
    __assert_fail("LevelD == LevelR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                  ,0x24b,"void Acb_NtkUpdateTiming(Acb_Ntk_t *, int)");
  }
  if (0 < iObj) {
    if (iVar6 <= iVar4) {
      Acb_NtkComputePathsD(p,p_00,0);
      bVar3 = true;
      goto LAB_0033a29c;
    }
    p_00 = Acb_ObjCollectTfi(p,-1,1);
    p_01 = Acb_ObjCollectTfo(p,-1,1);
    pVVar1 = p->vQue;
    piVar2 = pVVar1->pHeap;
    if (*piVar2 != -1) {
      __assertion = "p->pHeap[0] == -1";
      __line = 0x71;
LAB_0033a341:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                    ,__line,"void Vec_QueClear(Vec_Que_t *)");
    }
    for (uVar5 = 1; (long)uVar5 < (long)pVVar1->nSize; uVar5 = uVar5 + 1) {
      lVar7 = (long)piVar2[uVar5];
      if ((lVar7 < 0) || (uVar5 != (uint)pVVar1->pOrder[lVar7])) {
        __assertion = "p->pHeap[i] >= 0 && p->pOrder[p->pHeap[i]] == i";
        __line = 0x74;
        goto LAB_0033a341;
      }
      pVVar1->pOrder[lVar7] = -1;
      piVar2[uVar5] = -1;
    }
    pVVar1->nSize = 1;
  }
  bVar3 = false;
LAB_0033a29c:
  Acb_NtkComputePathsD(p,p_01,1);
  iVar6 = p->nPaths;
  if (bVar3) {
    Acb_NtkComputePathsR(p,p_01,0);
  }
  Acb_NtkComputePathsR(p,p_00,1);
  if (iVar6 == p->nPaths) {
    for (iVar6 = 0; iVar6 < p_00->nSize; iVar6 = iVar6 + 1) {
      iVar4 = Vec_IntEntry(p_00,iVar6);
      Acb_ObjUpdatePriority(p,iVar4);
    }
    if (bVar3) {
      for (iVar6 = 0; iVar6 < p_01->nSize; iVar6 = iVar6 + 1) {
        iVar4 = Vec_IntEntry(p_01,iVar6);
        Acb_ObjUpdatePriority(p,iVar4);
      }
    }
    return;
  }
  __assert_fail("nPaths1 == nPaths2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                ,0x25c,"void Acb_NtkUpdateTiming(Acb_Ntk_t *, int)");
}

Assistant:

void Acb_NtkUpdateTiming( Acb_Ntk_t * p, int iObj )
{
    int i, Entry, LevelMax = p->LevelMax;
    int LevelD, LevelR, nPaths1, nPaths2;
    // assuming that direct level of the new nodes (including iObj) is up to date
    Vec_Int_t * vTfi = Acb_ObjCollectTfi( p, iObj, 1 );
    Vec_Int_t * vTfo = Acb_ObjCollectTfo( p, iObj, 1 );
    if ( iObj > 0 )
    {
        assert( Vec_IntEntryLast(vTfi) == iObj );
        assert( Vec_IntEntryLast(vTfo) == iObj );
        Vec_IntPop( vTfo );
    }
    Acb_NtkComputeLevelD( p, vTfo );
    LevelD = p->LevelMax;
    Acb_NtkComputeLevelR( p, vTfi );
    LevelR = p->LevelMax;
    assert( LevelD == LevelR );
    if ( iObj > 0 && LevelMax > p->LevelMax ) // reduced level
    {
        iObj = -1;
        vTfi = Acb_ObjCollectTfi( p, -1, 1 );
        vTfo = Acb_ObjCollectTfo( p, -1, 1 );   
        Vec_QueClear( p->vQue );
        // add backup here
    }
    if ( iObj > 0 )
    Acb_NtkComputePathsD( p, vTfi, 0 );
    Acb_NtkComputePathsD( p, vTfo, 1 );
    nPaths1 = p->nPaths;
    if ( iObj > 0 )
    Acb_NtkComputePathsR( p, vTfo, 0 );
    Acb_NtkComputePathsR( p, vTfi, 1 );
    nPaths2 = p->nPaths;
    assert( nPaths1 == nPaths2 );
    Vec_IntForEachEntry( vTfi, Entry, i )
        Acb_ObjUpdatePriority( p, Entry );
    if ( iObj > 0 )
    Vec_IntForEachEntry( vTfo, Entry, i )
        Acb_ObjUpdatePriority( p, Entry );

//    printf( "Updating timing for object %d.\n", iObj );
//    Acb_NtkPrintPaths( p );
//    while ( (Entry = (int)Vec_QueTopPriority(p->vQue)) > 0 )
//        printf( "Obj = %5d : Prio = %d.\n", Vec_QuePop(p->vQue), Entry );
}